

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O1

void * CharacterUnion::UnPack(void *obj,Character type,resolver_function_t *resolver)

{
  uint uVar1;
  undefined4 uVar2;
  string *psVar3;
  ushort uVar4;
  undefined7 in_register_00000031;
  String *ptr;
  
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 1:
    psVar3 = (string *)operator_new(4);
    *(undefined4 *)psVar3 = 0;
    uVar2 = 0;
    uVar4 = 0;
    if (4 < *(ushort *)((long)obj - (long)*obj)) {
      uVar4 = *(ushort *)((long)obj + (4 - (long)*obj));
    }
    if (uVar4 != 0) {
      uVar2 = *(undefined4 *)((long)obj + (ulong)uVar4);
    }
    goto LAB_0019fac6;
  case 2:
  case 3:
  case 4:
    psVar3 = (string *)operator_new(4);
    uVar2 = *obj;
LAB_0019fac6:
    *(undefined4 *)psVar3 = uVar2;
    break;
  case 5:
    psVar3 = (string *)operator_new(0x20);
    uVar1 = *obj;
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar3,(long)obj + 4,(long)obj + (ulong)uVar1 + 4);
    break;
  case 6:
    psVar3 = (string *)operator_new(0x20);
    uVar1 = *obj;
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar3,(long)obj + 4,(long)obj + (ulong)uVar1 + 4);
    break;
  default:
    psVar3 = (string *)0x0;
  }
  return psVar3;
}

Assistant:

inline void *CharacterUnion::UnPack(const void *obj, Character type, const ::flatbuffers::resolver_function_t *resolver) {
  (void)resolver;
  switch (type) {
    case Character_MuLan: {
      auto ptr = reinterpret_cast<const Attacker *>(obj);
      return ptr->UnPack(resolver);
    }
    case Character_Rapunzel: {
      auto ptr = reinterpret_cast<const Rapunzel *>(obj);
      return new Rapunzel(*ptr);
    }
    case Character_Belle: {
      auto ptr = reinterpret_cast<const BookReader *>(obj);
      return new BookReader(*ptr);
    }
    case Character_BookFan: {
      auto ptr = reinterpret_cast<const BookReader *>(obj);
      return new BookReader(*ptr);
    }
    case Character_Other: {
      auto ptr = reinterpret_cast<const ::flatbuffers::String *>(obj);
      return new std::string(ptr->c_str(), ptr->size());
    }
    case Character_Unused: {
      auto ptr = reinterpret_cast<const ::flatbuffers::String *>(obj);
      return new std::string(ptr->c_str(), ptr->size());
    }
    default: return nullptr;
  }
}